

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

void __thiscall OrPattern::~OrPattern(OrPattern *this)

{
  bool bVar1;
  reference ppDVar2;
  __normal_iterator<DisjointPattern_**,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_28;
  DisjointPattern **local_20;
  __normal_iterator<DisjointPattern_**,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_18;
  iterator iter;
  OrPattern *this_local;
  
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__OrPattern_0085a078;
  iter._M_current = (DisjointPattern **)this;
  __gnu_cxx::
  __normal_iterator<DisjointPattern_**,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  ::__normal_iterator(&local_18);
  local_20 = (DisjointPattern **)
             std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                       (&this->orlist);
  local_18._M_current = local_20;
  while( true ) {
    local_28._M_current =
         (DisjointPattern **)
         std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end(&this->orlist);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppDVar2 = __gnu_cxx::
              __normal_iterator<DisjointPattern_**,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
              ::operator*(&local_18);
    if (*ppDVar2 != (DisjointPattern *)0x0) {
      (*((*ppDVar2)->super_Pattern)._vptr_Pattern[1])();
    }
    __gnu_cxx::
    __normal_iterator<DisjointPattern_**,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::~vector(&this->orlist);
  Pattern::~Pattern(&this->super_Pattern);
  return;
}

Assistant:

OrPattern::~OrPattern(void)

{
  vector<DisjointPattern *>::iterator iter;

  for(iter=orlist.begin();iter!=orlist.end();++iter)
    delete *iter;
}